

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entropy.c
# Opt level: O0

void av1_default_coef_probs(AV1_COMMON *cm)

{
  int iVar1;
  long in_RDI;
  int index;
  
  iVar1 = get_q_ctx(*(int *)(in_RDI + 0x268));
  memcpy(*(void **)(in_RDI + 0x6090),av1_default_txb_skip_cdfs + iVar1,0x186);
  memcpy((void *)(*(long *)(in_RDI + 0x6090) + 0x186),av1_default_eob_extra_cdfs + iVar1,0x21c);
  memcpy((void *)(*(long *)(in_RDI + 0x6090) + 0x3a2),av1_default_dc_sign_cdfs + iVar1,0x24);
  memcpy((void *)(*(long *)(in_RDI + 0x6090) + 0x1766),av1_default_coeff_lps_multi_cdfs + iVar1,
         0x834);
  memcpy((void *)(*(long *)(in_RDI + 0x6090) + 0x6fe),av1_default_coeff_base_multi_cdfs + iVar1,
         0x1068);
  memcpy((void *)(*(long *)(in_RDI + 0x6090) + 0x5be),av1_default_coeff_base_eob_multi_cdfs + iVar1,
         0x140);
  memcpy((void *)(*(long *)(in_RDI + 0x6090) + 0x3c6),av1_default_eob_multi16_cdfs + iVar1,0x30);
  memcpy((void *)(*(long *)(in_RDI + 0x6090) + 0x3f6),av1_default_eob_multi32_cdfs + iVar1,0x38);
  memcpy((void *)(*(long *)(in_RDI + 0x6090) + 0x42e),av1_default_eob_multi64_cdfs + iVar1,0x40);
  memcpy((void *)(*(long *)(in_RDI + 0x6090) + 0x46e),av1_default_eob_multi128_cdfs + iVar1,0x48);
  memcpy((void *)(*(long *)(in_RDI + 0x6090) + 0x4b6),av1_default_eob_multi256_cdfs + iVar1,0x50);
  memcpy((void *)(*(long *)(in_RDI + 0x6090) + 0x506),av1_default_eob_multi512_cdfs + iVar1,0x58);
  memcpy((void *)(*(long *)(in_RDI + 0x6090) + 0x55e),av1_default_eob_multi1024_cdfs + iVar1,0x60);
  return;
}

Assistant:

void av1_default_coef_probs(AV1_COMMON *cm) {
  const int index = get_q_ctx(cm->quant_params.base_qindex);
#if CONFIG_ENTROPY_STATS
  cm->coef_cdf_category = index;
#endif

  av1_copy(cm->fc->txb_skip_cdf, av1_default_txb_skip_cdfs[index]);
  av1_copy(cm->fc->eob_extra_cdf, av1_default_eob_extra_cdfs[index]);
  av1_copy(cm->fc->dc_sign_cdf, av1_default_dc_sign_cdfs[index]);
  av1_copy(cm->fc->coeff_br_cdf, av1_default_coeff_lps_multi_cdfs[index]);
  av1_copy(cm->fc->coeff_base_cdf, av1_default_coeff_base_multi_cdfs[index]);
  av1_copy(cm->fc->coeff_base_eob_cdf,
           av1_default_coeff_base_eob_multi_cdfs[index]);
  av1_copy(cm->fc->eob_flag_cdf16, av1_default_eob_multi16_cdfs[index]);
  av1_copy(cm->fc->eob_flag_cdf32, av1_default_eob_multi32_cdfs[index]);
  av1_copy(cm->fc->eob_flag_cdf64, av1_default_eob_multi64_cdfs[index]);
  av1_copy(cm->fc->eob_flag_cdf128, av1_default_eob_multi128_cdfs[index]);
  av1_copy(cm->fc->eob_flag_cdf256, av1_default_eob_multi256_cdfs[index]);
  av1_copy(cm->fc->eob_flag_cdf512, av1_default_eob_multi512_cdfs[index]);
  av1_copy(cm->fc->eob_flag_cdf1024, av1_default_eob_multi1024_cdfs[index]);
}